

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

int nni_ctx_getopt(nni_ctx *ctx,char *opt,void *v,size_t *szp,nni_type t)

{
  nni_option *pnVar1;
  char *__s2;
  int iVar2;
  int iVar3;
  nng_duration d;
  nni_mtx *mtx;
  
  mtx = &ctx->c_sock->s_mx;
  nni_mtx_lock(mtx);
  iVar2 = strcmp(opt,"recv-timeout");
  if (iVar2 == 0) {
    d = ctx->c_rcvtimeo;
  }
  else {
    iVar2 = strcmp(opt,"send-timeout");
    if (iVar2 != 0) {
      pnVar1 = (ctx->c_ops).ctx_options;
      iVar2 = 9;
      if (pnVar1 != (nni_option *)0x0) {
        __s2 = pnVar1->o_name;
        while (__s2 != (char *)0x0) {
          iVar3 = strcmp(opt,__s2);
          if (iVar3 == 0) {
            if (pnVar1->o_get == (_func_int_void_ptr_void_ptr_size_t_ptr_nni_type *)0x0) {
              iVar2 = 0x19;
            }
            else {
              iVar2 = (*pnVar1->o_get)(ctx->c_data,v,szp,t);
            }
            break;
          }
          __s2 = pnVar1[1].o_name;
          pnVar1 = pnVar1 + 1;
        }
      }
      goto LAB_00117115;
    }
    d = ctx->c_sndtimeo;
  }
  iVar2 = nni_copyout_ms(d,v,szp,t);
LAB_00117115:
  nni_mtx_unlock(mtx);
  return iVar2;
}

Assistant:

int
nni_ctx_getopt(nni_ctx *ctx, const char *opt, void *v, size_t *szp, nni_type t)
{
	nni_sock   *sock = ctx->c_sock;
	nni_option *o;
	int         rv = NNG_ENOTSUP;

	nni_mtx_lock(&sock->s_mx);
	if (strcmp(opt, NNG_OPT_RECVTIMEO) == 0) {
		rv = nni_copyout_ms(ctx->c_rcvtimeo, v, szp, t);
	} else if (strcmp(opt, NNG_OPT_SENDTIMEO) == 0) {
		rv = nni_copyout_ms(ctx->c_sndtimeo, v, szp, t);
	} else if (ctx->c_ops.ctx_options != NULL) {
		for (o = ctx->c_ops.ctx_options; o->o_name != NULL; o++) {
			if (strcmp(opt, o->o_name) != 0) {
				continue;
			}
			if (o->o_get == NULL) {
				rv = NNG_EWRITEONLY;
				break;
			}
			rv = o->o_get(ctx->c_data, v, szp, t);
			break;
		}
	}
	nni_mtx_unlock(&sock->s_mx);
	return (rv);
}